

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O1

void MWT::print_scalars(int f,v_array<float> *scalars,v_array<char> *tag)

{
  int *piVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  stringstream ss;
  char local_1d8;
  undefined7 uStack_1d7;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    if (scalars->_end != scalars->_begin) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          local_1d8 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
        }
        std::ostream::_M_insert<double>((double)scalars->_begin[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)scalars->_end - (long)scalars->_begin >> 2));
    }
    if (tag->_end != tag->_begin) {
      uVar3 = 0;
      do {
        if (uVar3 == 0) {
          local_1d8 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
        }
        local_1d8 = tag->_begin[uVar3];
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)tag->_end - (long)tag->_begin));
    }
    local_1d8 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    std::__cxx11::stringbuf::str();
    uVar3 = io_buf::write_file_or_socket
                      (f,(void *)CONCAT71(uStack_1d7,local_1d8),local_1d0 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    if (uVar3 != local_1d0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar1 = __errno_location();
      __s = strerror(*piVar1);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d1a10);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void print_scalars(int f, v_array<float>& scalars, v_array<char>& tag)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < scalars.size(); i++)
    {
      if (i > 0)
        ss << ' ';
      ss << scalars[i];
    }
    for (size_t i = 0; i < tag.size(); i++)
    {
      if (i == 0)
        ss << ' ';
      ss << tag[i];
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}